

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O2

int32 ngram_model_set_raw_score
                (ngram_model_t *base,int32 wid,int32 *history,int32 n_hist,int32 *n_used)

{
  int iVar1;
  logmath_t *plVar2;
  int32 iVar3;
  int logb_x;
  ulong uVar4;
  uint n_hist_00;
  ulong uVar5;
  undefined4 uVar6;
  long lVar7;
  
  n_hist_00 = base->n - 1;
  if (n_hist < (int)(uint)base->n) {
    n_hist_00 = n_hist;
  }
  uVar5 = 0;
  if (0 < (int)n_hist_00) {
    uVar5 = (ulong)n_hist_00;
  }
  if ((long)*(int *)&base[1].field_0x4 != -1) {
    plVar2 = base[1].lmath;
    iVar3 = *(int32 *)((long)(&(plVar2->t).table)[wid] + (long)*(int *)&base[1].field_0x4 * 4);
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      uVar6 = 0xffffffff;
      if ((long)history[uVar4] != -1) {
        uVar6 = *(undefined4 *)
                 ((long)(&(plVar2->t).table)[history[uVar4]] + (long)*(int *)&base[1].field_0x4 * 4)
        ;
      }
      *(undefined4 *)(*(long *)&base[1].lw + uVar4 * 4) = uVar6;
    }
    iVar3 = ngram_ng_prob(*(ngram_model_t **)
                           (base[1].n_counts + (long)*(int *)&base[1].field_0x4 * 2),iVar3,
                          *(int32 **)&base[1].lw,n_hist_00,n_used);
    return iVar3;
  }
  logb_x = base->log_zero;
  for (lVar7 = 0; lVar7 < base[1].refcount; lVar7 = lVar7 + 1) {
    plVar2 = base[1].lmath;
    iVar3 = *(int32 *)((long)(&(plVar2->t).table)[wid] + lVar7 * 4);
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      uVar6 = 0xffffffff;
      if ((long)history[uVar4] != -1) {
        uVar6 = *(undefined4 *)((long)(&(plVar2->t).table)[history[uVar4]] + lVar7 * 4);
      }
      *(undefined4 *)(*(long *)&base[1].lw + uVar4 * 4) = uVar6;
    }
    iVar1 = *(int *)(*(long *)&base[1].n + lVar7 * 4);
    plVar2 = base->lmath;
    iVar3 = ngram_ng_prob(*(ngram_model_t **)(base[1].n_counts + lVar7 * 2),iVar3,
                          *(int32 **)&base[1].lw,n_hist_00,n_used);
    logb_x = logmath_add(plVar2,logb_x,iVar1 + iVar3);
  }
  return logb_x;
}

Assistant:

static int32
ngram_model_set_raw_score(ngram_model_t * base, int32 wid,
                          int32 * history, int32 n_hist, int32 * n_used)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 mapwid;
    int32 score;
    int32 i;

    /* Truncate the history. */
    if (n_hist > base->n - 1)
        n_hist = base->n - 1;

    /* Interpolate if there is no current. */
    if (set->cur == -1) {
        score = base->log_zero;
        for (i = 0; i < set->n_models; ++i) {
            int32 j;
            /* Map word and history IDs for each model. */
            mapwid = set->widmap[wid][i];
            for (j = 0; j < n_hist; ++j) {
                if (history[j] == NGRAM_INVALID_WID)
                    set->maphist[j] = NGRAM_INVALID_WID;
                else
                    set->maphist[j] = set->widmap[history[j]][i];
            }
            score = logmath_add(base->lmath, score,
                                set->lweights[i] +
                                ngram_ng_prob(set->lms[i],
                                              mapwid, set->maphist, n_hist,
                                              n_used));
        }
    }
    else {
        int32 j;
        /* Map word and history IDs (FIXME: do this in a function?) */
        mapwid = set->widmap[wid][set->cur];
        for (j = 0; j < n_hist; ++j) {
            if (history[j] == NGRAM_INVALID_WID)
                set->maphist[j] = NGRAM_INVALID_WID;
            else
                set->maphist[j] = set->widmap[history[j]][set->cur];
        }
        score = ngram_ng_prob(set->lms[set->cur],
                              mapwid, set->maphist, n_hist, n_used);
    }

    return score;
}